

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFramebufferBlitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BlitRectCase::BlitRectCase
          (BlitRectCase *this,Context *context,char *name,char *desc,deUint32 filter,IVec2 *srcSize,
          IVec4 *srcRect,IVec2 *dstSize,IVec4 *dstRect,int cellSize)

{
  IVec2 *srcSize_local;
  deUint32 filter_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  BlitRectCase *this_local;
  
  FboTestCase::FboTestCase(&this->super_FboTestCase,context,name,desc,false);
  (this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BlitRectCase_032a3a98;
  this->m_filter = filter;
  tcu::Vector<int,_2>::Vector(&this->m_srcSize,srcSize);
  tcu::Vector<int,_4>::Vector(&this->m_srcRect,srcRect);
  tcu::Vector<int,_2>::Vector(&this->m_dstSize,dstSize);
  tcu::Vector<int,_4>::Vector(&this->m_dstRect,dstRect);
  this->m_cellSize = cellSize;
  tcu::Vector<float,_4>::Vector(&this->m_gridCellColorA,0.2,0.7,0.1,1.0);
  tcu::Vector<float,_4>::Vector(&this->m_gridCellColorB,0.7,0.1,0.5,0.8);
  return;
}

Assistant:

BlitRectCase (Context& context, const char* name, const char* desc, deUint32 filter, const IVec2& srcSize, const IVec4& srcRect, const IVec2& dstSize, const IVec4& dstRect, int cellSize = 8)
		: FboTestCase		(context, name, desc)
		, m_filter			(filter)
		, m_srcSize			(srcSize)
		, m_srcRect			(srcRect)
		, m_dstSize			(dstSize)
		, m_dstRect			(dstRect)
		, m_cellSize		(cellSize)
		, m_gridCellColorA	(0.2f, 0.7f, 0.1f, 1.0f)
		, m_gridCellColorB	(0.7f, 0.1f, 0.5f, 0.8f)
	{
	}